

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceHeaderDataChanged
          (QSortFilterProxyModelPrivate *this,Orientation orientation,int start,int end)

{
  int *piVar1;
  QObject *this_00;
  Span *pSVar2;
  int iVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  long lVar7;
  ulong uVar8;
  int _t3;
  int iVar9;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  const_iterator cVar12;
  Data *local_58;
  int *piStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  local_58 = (Data *)0xffffffffffffffff;
  piStack_50 = (int *)0x0;
  tStack_48.ptr = (QAbstractItemModel *)0x0;
  cVar12 = create_mapping(this,(QModelIndex *)&local_58);
  pSVar2 = (cVar12.i.d)->spans;
  uVar8 = cVar12.i.bucket >> 7;
  lVar7 = *(long *)(pSVar2[uVar8].entries[pSVar2[uVar8].offsets[(uint)cVar12.i.bucket & 0x7f]].
                    storage.data + 0x18);
  local_58 = (Data *)0x0;
  piStack_50 = (int *)0x0;
  tStack_48.ptr = (QAbstractItemModel *)0x0;
  QList<int>::reserve((QList<int> *)&local_58,(long)((end - start) + 1));
  lVar11 = lVar7 + 0x30;
  if (orientation != Vertical) {
    lVar11 = lVar7 + 0x48;
  }
  lVar7 = *(long *)(lVar11 + 8);
  for (lVar11 = (long)start << 2; (long)end * 4 + 4 != lVar11; lVar11 = lVar11 + 4) {
    iVar9 = *(int *)(lVar7 + lVar11);
    if (iVar9 != -1) {
      QList<int>::append((QList<int> *)&local_58,iVar9);
    }
  }
  iVar5 = QList<int>::begin((QList<int> *)&local_58);
  iVar6 = QList<int>::end((QList<int> *)&local_58);
  std::__sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar5.i,iVar6.i);
  iVar10 = (int)tStack_48.ptr;
  iVar9 = 0;
  do {
    if (iVar10 <= iVar9) {
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    lVar7 = (long)iVar9;
    piVar1 = piStack_50 + lVar7;
    iVar4 = *piVar1;
    do {
      _t3 = iVar4;
      lVar7 = lVar7 + 1;
      iVar3 = iVar10;
      if (iVar10 <= lVar7) break;
      iVar9 = iVar9 + 1;
      iVar3 = iVar9;
      iVar4 = piStack_50[lVar7];
    } while (piStack_50[lVar7] == _t3 + 1);
    iVar9 = iVar3;
    QAbstractItemModel::headerDataChanged((QAbstractItemModel *)this_00,orientation,*piVar1,_t3);
  } while( true );
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceHeaderDataChanged(Qt::Orientation orientation,
                                                           int start, int end)
{
    Q_ASSERT(start <= end);

    Q_Q(QSortFilterProxyModel);
    Mapping *m = create_mapping(QModelIndex()).value();

    const QList<int> &source_to_proxy = (orientation == Qt::Vertical) ? m->proxy_rows : m->proxy_columns;

    QList<int> proxy_positions;
    proxy_positions.reserve(end - start + 1);
    {
        Q_ASSERT(source_to_proxy.size() > end);
        QList<int>::const_iterator it = source_to_proxy.constBegin() + start;
        const QList<int>::const_iterator endIt = source_to_proxy.constBegin() + end + 1;
        for ( ; it != endIt; ++it) {
            if (*it != -1)
                proxy_positions.push_back(*it);
        }
    }

    std::sort(proxy_positions.begin(), proxy_positions.end());

    int last_index = 0;
    const int numItems = proxy_positions.size();
    while (last_index < numItems) {
        const int proxyStart = proxy_positions.at(last_index);
        int proxyEnd = proxyStart;
        ++last_index;
        for (int i = last_index; i < numItems; ++i) {
            if (proxy_positions.at(i) == proxyEnd + 1) {
                ++last_index;
                ++proxyEnd;
            } else {
                break;
            }
        }
        emit q->headerDataChanged(orientation, proxyStart, proxyEnd);
    }
}